

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputparser.cpp
# Opt level: O0

void __thiscall ObjectParser::parseLine(ObjectParser *this,string *line,int section)

{
  Network *pNVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  InputError *pIVar7;
  string local_3d0 [32];
  string local_3b0 [39];
  undefined1 local_389;
  string local_388 [32];
  string local_368 [39];
  allocator local_341;
  string local_340 [38];
  char local_31a;
  undefined1 local_319;
  string local_318 [6];
  char chLine_1;
  string local_2f8 [39];
  undefined1 local_2d1;
  string local_2d0 [39];
  undefined1 local_2a9;
  string local_2a8 [32];
  string local_288 [39];
  undefined1 local_261;
  string local_260 [39];
  undefined1 local_239;
  string local_238 [32];
  string local_218 [39];
  undefined1 local_1f1;
  string local_1f0 [39];
  undefined1 local_1c9;
  string local_1c8 [32];
  string local_1a8 [39];
  undefined1 local_181;
  string local_180 [39];
  undefined1 local_159;
  string local_158 [32];
  string local_138 [39];
  undefined1 local_111;
  string local_110 [39];
  undefined1 local_e9;
  string local_e8 [32];
  string local_c8 [39];
  undefined1 local_a1;
  string local_a0 [51];
  char local_6d;
  int local_6c;
  undefined4 uStack_68;
  char chLine;
  int i;
  string local_60 [4];
  int type;
  string s2;
  string local_40 [8];
  string s1;
  int section_local;
  string *line_local;
  ObjectParser *this_local;
  
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  i = 0;
  if ((this->super_InputParser).network == (Network *)0x0) {
    uStack_68 = 1;
  }
  else {
    for (local_6c = 0; uVar4 = (ulong)local_6c, uVar5 = std::__cxx11::string::length(),
        uVar4 < uVar5; local_6c = local_6c + 1) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)line);
      local_6d = *pcVar6;
      if ((local_6d == ' ') || (local_6d == '\t')) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) break;
      }
      else {
        std::__cxx11::string::operator+=(local_40,local_6d);
      }
    }
    switch(section) {
    case 1:
      iVar3 = Network::indexOf((this->super_InputParser).network,NODE,(string *)local_40);
      if (-1 < iVar3) {
        local_a1 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_a0,local_40);
        InputError::InputError(pIVar7,4,(string *)local_a0);
        local_a1 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      pNVar1 = (this->super_InputParser).network;
      std::__cxx11::string::string(local_c8,local_40);
      bVar2 = Network::addElement(pNVar1,NODE,0,(string *)local_c8);
      std::__cxx11::string::~string(local_c8);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_e9 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_e8,local_40);
        InputError::InputError(pIVar7,1,(string *)local_e8);
        local_e9 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      break;
    case 2:
      iVar3 = Network::indexOf((this->super_InputParser).network,NODE,(string *)local_40);
      if (-1 < iVar3) {
        local_111 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_110,local_40);
        InputError::InputError(pIVar7,4,(string *)local_110);
        local_111 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      pNVar1 = (this->super_InputParser).network;
      std::__cxx11::string::string(local_138,local_40);
      bVar2 = Network::addElement(pNVar1,NODE,2,(string *)local_138);
      std::__cxx11::string::~string(local_138);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_159 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_158,local_40);
        InputError::InputError(pIVar7,1,(string *)local_158);
        local_159 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      break;
    case 3:
      iVar3 = Network::indexOf((this->super_InputParser).network,NODE,(string *)local_40);
      if (-1 < iVar3) {
        local_181 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_180,local_40);
        InputError::InputError(pIVar7,4,(string *)local_180);
        local_181 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      pNVar1 = (this->super_InputParser).network;
      std::__cxx11::string::string(local_1a8,local_40);
      bVar2 = Network::addElement(pNVar1,NODE,1,(string *)local_1a8);
      std::__cxx11::string::~string(local_1a8);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_1c9 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_1c8,local_40);
        InputError::InputError(pIVar7,1,(string *)local_1c8);
        local_1c9 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      break;
    case 4:
      iVar3 = Network::indexOf((this->super_InputParser).network,LINK,(string *)local_40);
      if (-1 < iVar3) {
        local_1f1 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_1f0,local_40);
        InputError::InputError(pIVar7,4,(string *)local_1f0);
        local_1f1 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      pNVar1 = (this->super_InputParser).network;
      std::__cxx11::string::string(local_218,local_40);
      bVar2 = Network::addElement(pNVar1,LINK,0,(string *)local_218);
      std::__cxx11::string::~string(local_218);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_239 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_238,local_40);
        InputError::InputError(pIVar7,1,(string *)local_238);
        local_239 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      break;
    case 5:
      iVar3 = Network::indexOf((this->super_InputParser).network,LINK,(string *)local_40);
      if (-1 < iVar3) {
        local_261 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_260,local_40);
        InputError::InputError(pIVar7,4,(string *)local_260);
        local_261 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      pNVar1 = (this->super_InputParser).network;
      std::__cxx11::string::string(local_288,local_40);
      bVar2 = Network::addElement(pNVar1,LINK,1,(string *)local_288);
      std::__cxx11::string::~string(local_288);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_2a9 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_2a8,local_40);
        InputError::InputError(pIVar7,1,(string *)local_2a8);
        local_2a9 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      break;
    case 6:
      iVar3 = Network::indexOf((this->super_InputParser).network,LINK,(string *)local_40);
      if (-1 < iVar3) {
        local_2d1 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_2d0,local_40);
        InputError::InputError(pIVar7,4,(string *)local_2d0);
        local_2d1 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      pNVar1 = (this->super_InputParser).network;
      std::__cxx11::string::string(local_2f8,local_40);
      bVar2 = Network::addElement(pNVar1,LINK,2,(string *)local_2f8);
      std::__cxx11::string::~string(local_2f8);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_319 = 1;
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_318,local_40);
        InputError::InputError(pIVar7,1,(string *)local_318);
        local_319 = 0;
        __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
      }
      break;
    case 7:
      iVar3 = Network::indexOf((this->super_InputParser).network,PATTERN,(string *)local_40);
      if (iVar3 < 0) {
        for (; uVar4 = (ulong)local_6c, uVar5 = std::__cxx11::string::length(), uVar4 < uVar5;
            local_6c = local_6c + 1) {
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)line);
          local_31a = *pcVar6;
          if ((local_31a == ' ') || (local_31a == '\t')) {
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) break;
          }
          else {
            std::__cxx11::string::operator+=(local_60,local_31a);
          }
        }
        pcVar6 = w_Variable;
        i = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_340,pcVar6,&local_341);
        bVar2 = Utilities::match((string *)local_60,(string *)local_340);
        std::__cxx11::string::~string(local_340);
        std::allocator<char>::~allocator((allocator<char> *)&local_341);
        if (bVar2) {
          i = 1;
        }
        iVar3 = i;
        pNVar1 = (this->super_InputParser).network;
        std::__cxx11::string::string(local_368,local_40);
        bVar2 = Network::addElement(pNVar1,PATTERN,iVar3,(string *)local_368);
        std::__cxx11::string::~string(local_368);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          local_389 = 1;
          pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_388,local_40);
          InputError::InputError(pIVar7,1,(string *)local_388);
          local_389 = 0;
          __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
        }
      }
      break;
    case 8:
      iVar3 = Network::indexOf((this->super_InputParser).network,CURVE,(string *)local_40);
      if (iVar3 < 0) {
        pNVar1 = (this->super_InputParser).network;
        std::__cxx11::string::string(local_3b0,local_40);
        bVar2 = Network::addElement(pNVar1,CURVE,0,(string *)local_3b0);
        std::__cxx11::string::~string(local_3b0);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_3d0,local_40);
          InputError::InputError(pIVar7,1,(string *)local_3d0);
          __cxa_throw(pIVar7,&InputError::typeinfo,InputError::~InputError);
        }
      }
    }
    uStack_68 = 0;
  }
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void ObjectParser::parseLine(string& line, int section)
{
    string s1;
    string s2;
    int    type = 0;

    // ... read first string token from input line

    if (network == 0) return;
    int i = 0;
    for (; i < line.length(); i++)
    {
        char chLine = line[i];
        if (chLine == ' ' || chLine == '\t')
        {
            if (s1.empty())
                continue;
            else
                break;
        }
        else
        {
            s1 += chLine;
        }
    }

    // ... create new object whose type is determined by current file section

    switch(section)
    {
    case InputReader::JUNCTION:
        if ( network->indexOf(Element::NODE, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::NODE, Node::JUNCTION, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::RESERVOIR:
        if ( network->indexOf(Element::NODE, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::NODE, Node::RESERVOIR, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::TANK:
        if ( network->indexOf(Element::NODE, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::NODE, Node::TANK, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::PIPE:
        if ( network->indexOf(Element::LINK, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::LINK, Link::PIPE, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::PUMP:
        if ( network->indexOf(Element::LINK, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::LINK, Link::PUMP, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::VALVE:
        if ( network->indexOf(Element::LINK, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::LINK, Link::VALVE, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::PATTERN:
        // Check if pattern already created
        if ( network->indexOf(Element::PATTERN, s1 ) >= 0) break;

        // Check if pattern is Fixed or Variable
        for (; i < line.length(); i++)
        {
            char chLine = line[i];
            if (chLine == ' ' || chLine == '\t')
            {
                if (s2.empty())
                    continue;
                else
                    break;
            }
            else
            {
                s2 += chLine;
            }
        }
        type = Pattern::FIXED_PATTERN;
        if (Utilities::match(s2, w_Variable)) type = Pattern::VARIABLE_PATTERN;

        if ( !network->addElement(Element::PATTERN, type, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::CURVE:
        // Check if curve already created
        if ( network->indexOf(Element::CURVE, s1) >= 0 ) break;
        if ( !network->addElement(Element::CURVE, 0, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

/*
    case InputReader::RULE:
        // Check for Rule keyword
        if (Utilities::match(s1, w_Rule))
        {
            // Parse rule's name
            sin >> s2;
            if (sin.fail()) return InputError::TOO_FEW_ITEMS;

            // Check if rule with same name already exists
            if (network->indexOf(Element::CONTROL, s2) >= 0)
                return InputError::DUPLICATE_ID;

            // Add new rule
            network->addElement(Element::CONTROL, s2);
        }
        break;
*/
    }
}